

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O2

void __thiscall ktx::CommandInfo::executeInfo(CommandInfo *this)

{
  Reporter *report;
  OutputFormat OVar1;
  bool minified;
  ktx_error_code_e kVar2;
  char *in_RCX;
  string_view filepath;
  char *local_3f8;
  string local_3f0;
  InputStream inputStream;
  
  report = &(this->super_Command).super_Reporter;
  InputStream::InputStream(&inputStream,&(this->options).super_OptionsSingleIn.inputFilepath,report)
  ;
  OVar1 = (this->options).super_OptionsFormat.format;
  if (OVar1 == json_mini) {
    minified = true;
  }
  else {
    if (OVar1 != json) {
      if (OVar1 != text) {
        __assert_fail("false && \"Internal error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp"
                      ,0x7e,"void ktx::CommandInfo::executeInfo()");
      }
      kVar2 = printInfoText(this,inputStream.activeStream);
      goto LAB_00183532;
    }
    minified = false;
  }
  kVar2 = printInfoJSON(this,inputStream.activeStream,minified);
LAB_00183532:
  if (kVar2 != KTX_SUCCESS) {
    filepath._M_str = in_RCX;
    filepath._M_len = (size_t)(this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
    fmtInFile_abi_cxx11_
              (&local_3f0,
               (ktx *)(this->options).super_OptionsSingleIn.inputFilepath._M_string_length,filepath)
    ;
    local_3f8 = (char *)ktxErrorString(kVar2);
    Reporter::fatal<char_const(&)[37],std::__cxx11::string,char_const*>
              (report,INVALID_FILE,(char (*) [37])"Failed to process KTX2 file \"{}\": {}",
               &local_3f0,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  InputStream::~InputStream(&inputStream);
  return;
}

Assistant:

void CommandInfo::executeInfo() {
    InputStream inputStream(options.inputFilepath, *this);

    KTX_error_code result;

    switch (options.format) {
    case OutputFormat::text:
        result = printInfoText(inputStream);
        break;
    case OutputFormat::json:
        result = printInfoJSON(inputStream, false);
        break;
    case OutputFormat::json_mini:
        result = printInfoJSON(inputStream, true);
        break;
    default:
        assert(false && "Internal error");
        return;
    }

    if (result != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to process KTX2 file \"{}\": {}", fmtInFile(options.inputFilepath), ktxErrorString(result));
}